

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int populate_reuse_comp_type_data
              (MACROBLOCK *x,MB_MODE_INFO *mbmi,BEST_COMP_TYPE_STATS *best_type_stats,int_mv *cur_mv
              ,int32_t *comp_rate,int64_t *comp_dist,int *comp_rs2,int *rate_mv,int64_t *rd,
              int match_index)

{
  byte cur_type;
  undefined8 uVar1;
  uint uVar2;
  int_mv *in_RCX;
  long lVar3;
  long in_RDX;
  MB_MODE_INFO *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int winner_comp_type;
  int local_4;
  
  cur_type = *(byte *)(in_RDI + (long)(int)cur_mv * 0xa0 + 0x1c6eb);
  uVar2 = (uint)cur_type;
  if (*(int *)(in_R8 + (long)(int)uVar2 * 4) == 0x7fffffff) {
    local_4 = *(int *)(in_RDX + 0x18);
  }
  else {
    update_mbmi_for_compound_type(in_RSI,cur_type);
    lVar3 = in_RDI + 0x1c650 + (long)(int)cur_mv * 0xa0;
    (in_RSI->interinter_comp).seg_mask = *(uint8_t **)(lVar3 + 0x90);
    uVar1 = *(undefined8 *)(lVar3 + 0x98);
    (in_RSI->interinter_comp).wedge_index = (char)uVar1;
    (in_RSI->interinter_comp).wedge_sign = (char)((ulong)uVar1 >> 8);
    (in_RSI->interinter_comp).mask_type = (char)((ulong)uVar1 >> 0x10);
    (in_RSI->interinter_comp).type = (char)((ulong)uVar1 >> 0x18);
    *(int *)&(in_RSI->interinter_comp).field_0xc = (int)((ulong)uVar1 >> 0x20);
    *(long *)comp_rate =
         ((long)(*(int *)(in_stack_00000008 + (long)(int)uVar2 * 4) + (int)*comp_dist +
                *(int *)(in_R8 + (long)(int)uVar2 * 4)) * (long)*(int *)(in_RDI + 0x4218) + 0x100 >>
         9) + *(long *)(in_R9 + (long)(int)uVar2 * 8) * 0x80;
    in_RSI->mv[0] = *in_RCX;
    in_RSI->mv[1] = in_RCX[1];
    local_4 = *(int *)(in_stack_00000008 + (long)(int)uVar2 * 4);
  }
  return local_4;
}

Assistant:

static inline int populate_reuse_comp_type_data(
    const MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BEST_COMP_TYPE_STATS *best_type_stats, int_mv *cur_mv, int32_t *comp_rate,
    int64_t *comp_dist, int *comp_rs2, int *rate_mv, int64_t *rd,
    int match_index) {
  const int winner_comp_type =
      x->comp_rd_stats[match_index].interinter_comp.type;
  if (comp_rate[winner_comp_type] == INT_MAX)
    return best_type_stats->best_compmode_interinter_cost;
  update_mbmi_for_compound_type(mbmi, winner_comp_type);
  mbmi->interinter_comp = x->comp_rd_stats[match_index].interinter_comp;
  *rd = RDCOST(
      x->rdmult,
      comp_rs2[winner_comp_type] + *rate_mv + comp_rate[winner_comp_type],
      comp_dist[winner_comp_type]);
  mbmi->mv[0].as_int = cur_mv[0].as_int;
  mbmi->mv[1].as_int = cur_mv[1].as_int;
  return comp_rs2[winner_comp_type];
}